

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

bool el::base::utils::Utils::
     installCallback<el::base::DefaultLogDispatchCallback,std::shared_ptr<el::LogDispatchCallback>>
               (string *id,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
               *mapT)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  DefaultLogDispatchCallback *__p;
  shared_ptr<el::LogDispatchCallback> sStack_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_58;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
          ::find(&mapT->_M_t,id);
  p_Var1 = &(mapT->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
    __p = (DefaultLogDispatchCallback *)operator_new(0x18);
    __p->m_data = (LogDispatchData *)0x0;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)0x0;
    *(undefined8 *)
     &(__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
      field_0x8 = 0;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.field_0x9
         = 1;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0019b3e0;
    ::std::__shared_ptr<el::LogDispatchCallback,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<el::base::DefaultLogDispatchCallback,void>
              ((__shared_ptr<el::LogDispatchCallback,(__gnu_cxx::_Lock_policy)2> *)&sStack_68,__p);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
    ::pair<std::shared_ptr<el::LogDispatchCallback>,_true>(&local_58,id,&sStack_68);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
                *)mapT,&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
    ::~pair(&local_58);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &sStack_68.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return (_Rb_tree_header *)iVar2._M_node == p_Var1;
}

Assistant:

static bool installCallback(const std::string& id, std::map<std::string, TPtr>* mapT) {
    if (mapT->find(id) == mapT->end()) {
      mapT->insert(std::make_pair(id, TPtr(new T())));
      return true;
    }
    return false;
  }